

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_finalize(sqlite3_stmt *pStmt)

{
  int iVar1;
  Vdbe *in_RDI;
  sqlite3 *db;
  Vdbe *v;
  sqlite3 *in_stack_00000010;
  int rc;
  sqlite3 *db_00;
  int local_14;
  
  if (in_RDI == (Vdbe *)0x0) {
    local_14 = 0;
  }
  else {
    db_00 = in_RDI->db;
    iVar1 = vdbeSafety((Vdbe *)db_00);
    if (iVar1 != 0) {
      iVar1 = sqlite3MisuseError(0);
      return iVar1;
    }
    sqlite3_mutex_enter((sqlite3_mutex *)0x13adbc);
    if (0 < in_RDI->startTime) {
      invokeProfileCallback(db_00,(Vdbe *)0x13add9);
    }
    sqlite3VdbeReset(in_RDI);
    sqlite3VdbeDelete(in_RDI);
    local_14 = sqlite3ApiExit(db_00,0);
    sqlite3LeaveMutexAndCloseZombie(in_stack_00000010);
  }
  return local_14;
}

Assistant:

SQLITE_API int sqlite3_finalize(sqlite3_stmt *pStmt){
  int rc;
  if( pStmt==0 ){
    /* IMPLEMENTATION-OF: R-57228-12904 Invoking sqlite3_finalize() on a NULL
    ** pointer is a harmless no-op. */
    rc = SQLITE_OK;
  }else{
    Vdbe *v = (Vdbe*)pStmt;
    sqlite3 *db = v->db;
    if( vdbeSafety(v) ) return SQLITE_MISUSE_BKPT;
    sqlite3_mutex_enter(db->mutex);
    checkProfileCallback(db, v);
    assert( v->eVdbeState>=VDBE_READY_STATE );
    rc = sqlite3VdbeReset(v);
    sqlite3VdbeDelete(v);
    rc = sqlite3ApiExit(db, rc);
    sqlite3LeaveMutexAndCloseZombie(db);
  }
  return rc;
}